

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::UnicodeString::append(UnicodeString *this,UChar32 srcChar)

{
  bool bVar1;
  UnicodeString *local_30;
  int32_t local_1c;
  UChar local_18;
  ushort uStack_16;
  UBool isError;
  int32_t _length;
  UChar buffer [2];
  UChar32 srcChar_local;
  UnicodeString *this_local;
  
  local_1c = 0;
  bVar1 = false;
  if ((uint)srcChar < 0x10000) {
    local_1c = 1;
    local_18 = (UChar)srcChar;
  }
  else {
    bVar1 = 0x10ffff < (uint)srcChar;
    if (!bVar1) {
      local_18 = (short)(srcChar >> 10) + L'ퟀ';
      uStack_16 = (UChar)srcChar & 0x3ffU | 0xdc00;
      local_1c = 2;
    }
  }
  local_30 = this;
  if (!bVar1) {
    _length = srcChar;
    _buffer = this;
    local_30 = doAppend(this,&local_18,0,local_1c);
  }
  return local_30;
}

Assistant:

UnicodeString&
UnicodeString::append(UChar32 srcChar) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t _length = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, _length, U16_MAX_LENGTH, srcChar, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then _length==0 which turns the doAppend() into a no-op anyway.
  return isError ? *this : doAppend(buffer, 0, _length);
}